

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int encode_session_identifier
              (ptls_context_t *ctx,ptls_buffer_t *buf,uint32_t ticket_age_add,
              ptls_iovec_t ticket_nonce,ptls_key_schedule_t *sched,char *server_name,
              uint16_t key_exchange_id,uint16_t csid,char *negotiated_protocol)

{
  size_t sVar1;
  ptls_iovec_t nonce;
  ptls_buffer_t *ppVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  size_t body_size;
  size_t body_size_3;
  size_t body_start_3;
  size_t capacity_3;
  size_t body_size_2;
  size_t body_start_2;
  size_t capacity_2;
  undefined1 local_80;
  undefined1 local_7f;
  uint16_t local_7e;
  uint32_t _v_3;
  uint16_t _v_2;
  ulong uStack_78;
  uint16_t _v_1;
  size_t body_size_1;
  size_t body_start_1;
  size_t capacity_1;
  undefined8 local_58;
  uint64_t _v;
  size_t body_start;
  size_t capacity;
  ptls_key_schedule_t *ppStack_38;
  int ret;
  ptls_key_schedule_t *sched_local;
  ptls_buffer_t *ppStack_28;
  uint32_t ticket_age_add_local;
  ptls_buffer_t *buf_local;
  ptls_context_t *ctx_local;
  ptls_iovec_t ticket_nonce_local;
  
  ticket_nonce_local.base = (uint8_t *)ticket_nonce.len;
  ctx_local = (ptls_context_t *)ticket_nonce.base;
  capacity._4_4_ = 0;
  body_start = 2;
  ppStack_38 = sched;
  sched_local._4_4_ = ticket_age_add;
  ppStack_28 = buf;
  buf_local = (ptls_buffer_t *)ctx;
  capacity._4_4_ = ptls_buffer__do_pushv(buf,"",2);
  if (capacity._4_4_ != 0) {
    return capacity._4_4_;
  }
  _v = ppStack_28->off;
  capacity._4_4_ = ptls_buffer__do_pushv(ppStack_28,"ptls0001",8);
  if (capacity._4_4_ != 0) {
    return capacity._4_4_;
  }
  local_58 = (**(code **)buf_local->capacity)(buf_local->capacity);
  capacity_1._0_1_ = (undefined1)((ulong)local_58 >> 0x38);
  capacity_1._1_1_ = (undefined1)((ulong)local_58 >> 0x30);
  capacity_1._2_1_ = (undefined1)((ulong)local_58 >> 0x28);
  capacity_1._3_1_ = (undefined1)((ulong)local_58 >> 0x20);
  capacity_1._4_1_ = (undefined1)((ulong)local_58 >> 0x18);
  capacity_1._5_1_ = (undefined1)((ulong)local_58 >> 0x10);
  capacity_1._6_1_ = (undefined1)((ulong)local_58 >> 8);
  capacity_1._7_1_ = (undefined1)local_58;
  capacity._4_4_ = ptls_buffer__do_pushv(ppStack_28,&capacity_1,8);
  if (capacity._4_4_ != 0) {
    return capacity._4_4_;
  }
  body_start_1 = 2;
  capacity._4_4_ = ptls_buffer__do_pushv(ppStack_28,"",2);
  if (capacity._4_4_ != 0) {
    return capacity._4_4_;
  }
  body_size_1 = ppStack_28->off;
  capacity._4_4_ = ptls_buffer_reserve(ppStack_28,(ppStack_38->hashes[0].algo)->digest_size);
  if (capacity._4_4_ != 0) {
    return capacity._4_4_;
  }
  nonce.len = (size_t)ticket_nonce_local.base;
  nonce.base = (uint8_t *)ctx_local;
  capacity._4_4_ = derive_resumption_secret(ppStack_38,ppStack_28->base + ppStack_28->off,nonce);
  if (capacity._4_4_ != 0) {
    return capacity._4_4_;
  }
  ppStack_28->off = (ppStack_38->hashes[0].algo)->digest_size + ppStack_28->off;
  uStack_78 = ppStack_28->off - body_size_1;
  if (body_start_1 == 0xffffffffffffffff) {
    iVar3 = ptls_buffer__adjust_quic_blocksize(ppStack_28,uStack_78);
    if (iVar3 != 0) {
      return iVar3;
    }
  }
  else {
    if ((body_start_1 < 8) && ((ulong)(1L << ((byte)(body_start_1 << 3) & 0x3f)) <= uStack_78)) {
      return 0x20c;
    }
    for (; body_start_1 != 0; body_start_1 = body_start_1 - 1) {
      ppStack_28->base[body_size_1 - body_start_1] =
           (uint8_t)(uStack_78 >> (((char)body_start_1 + -1) * '\b' & 0x3fU));
    }
  }
  capacity._4_4_ = 0;
  _v_3._2_2_ = key_exchange_id;
  _v_3._0_1_ = (undefined1)(key_exchange_id >> 8);
  _v_3._1_1_ = (undefined1)key_exchange_id;
  capacity._4_4_ = ptls_buffer__do_pushv(ppStack_28,&_v_3,2);
  if (capacity._4_4_ != 0) {
    return capacity._4_4_;
  }
  local_7e = csid;
  local_80 = (undefined1)(csid >> 8);
  local_7f = (undefined1)csid;
  capacity._4_4_ = ptls_buffer__do_pushv(ppStack_28,&local_80,2);
  if (capacity._4_4_ != 0) {
    return capacity._4_4_;
  }
  capacity_2._4_4_ = sched_local._4_4_;
  capacity_2._0_1_ = (undefined1)(sched_local._4_4_ >> 0x18);
  capacity_2._1_1_ = (undefined1)(sched_local._4_4_ >> 0x10);
  capacity_2._2_1_ = (undefined1)(sched_local._4_4_ >> 8);
  capacity_2._3_1_ = (undefined1)sched_local._4_4_;
  capacity._4_4_ = ptls_buffer__do_pushv(ppStack_28,&capacity_2,4);
  if (capacity._4_4_ != 0) {
    return capacity._4_4_;
  }
  body_start_2 = 2;
  capacity._4_4_ = ptls_buffer__do_pushv(ppStack_28,"",2);
  ppVar2 = ppStack_28;
  if (capacity._4_4_ != 0) {
    return capacity._4_4_;
  }
  sVar1 = ppStack_28->off;
  if (((ulong)buf_local[9].base & 1) == 0) {
    if (server_name == (char *)0x0) goto LAB_0012e2a3;
    sVar5 = strlen(server_name);
    iVar3 = ptls_buffer__do_pushv(ppVar2,server_name,sVar5);
  }
  else {
    iVar3 = ptls_buffer__do_pushv(ppStack_28,buf_local + 8,0x20);
  }
  if (iVar3 != 0) {
    return iVar3;
  }
LAB_0012e2a3:
  uVar4 = ppStack_28->off - sVar1;
  if (uVar4 < 0x10000) {
    for (; body_start_2 != 0; body_start_2 = body_start_2 - 1) {
      ppStack_28->base[sVar1 - body_start_2] =
           (uint8_t)(uVar4 >> (((char)body_start_2 + -1) * '\b' & 0x3fU));
    }
    capacity._4_4_ = 0;
    body_start_3 = 1;
    capacity._4_4_ = ptls_buffer__do_pushv(ppStack_28,"",1);
    ppVar2 = ppStack_28;
    if (capacity._4_4_ == 0) {
      sVar1 = ppStack_28->off;
      if (negotiated_protocol != (char *)0x0) {
        sVar5 = strlen(negotiated_protocol);
        capacity._4_4_ = ptls_buffer__do_pushv(ppVar2,negotiated_protocol,sVar5);
        if (capacity._4_4_ != 0) {
          return capacity._4_4_;
        }
      }
      uVar4 = ppStack_28->off - sVar1;
      if (uVar4 < 0x100) {
        for (; body_start_3 != 0; body_start_3 = body_start_3 - 1) {
          ppStack_28->base[sVar1 - body_start_3] =
               (uint8_t)(uVar4 >> (((char)body_start_3 + -1) * '\b' & 0x3fU));
        }
        uVar4 = ppStack_28->off - _v;
        if (body_start == 0xffffffffffffffff) {
          capacity._4_4_ = ptls_buffer__adjust_quic_blocksize(ppStack_28,uVar4);
        }
        else if ((body_start < 8) && ((ulong)(1L << ((byte)(body_start << 3) & 0x3f)) <= uVar4)) {
          capacity._4_4_ = 0x20c;
        }
        else {
          for (; body_start != 0; body_start = body_start - 1) {
            ppStack_28->base[_v - body_start] =
                 (uint8_t)(uVar4 >> (((char)body_start + -1) * '\b' & 0x3fU));
          }
        }
      }
      else {
        capacity._4_4_ = 0x20c;
      }
    }
  }
  else {
    capacity._4_4_ = 0x20c;
  }
  return capacity._4_4_;
}

Assistant:

static int encode_session_identifier(ptls_context_t *ctx, ptls_buffer_t *buf, uint32_t ticket_age_add, ptls_iovec_t ticket_nonce,
                                     ptls_key_schedule_t *sched, const char *server_name, uint16_t key_exchange_id, uint16_t csid,
                                     const char *negotiated_protocol)
{
    int ret = 0;

    ptls_buffer_push_block(buf, 2, {
        /* format id */
        ptls_buffer_pushv(buf, SESSION_IDENTIFIER_MAGIC, SESSION_IDENTIFIER_MAGIC_SIZE);
        /* date */
        ptls_buffer_push64(buf, ctx->get_time->cb(ctx->get_time));
        /* resumption master secret */
        ptls_buffer_push_block(buf, 2, {
            if ((ret = ptls_buffer_reserve(buf, sched->hashes[0].algo->digest_size)) != 0)
                goto Exit;
            if ((ret = derive_resumption_secret(sched, buf->base + buf->off, ticket_nonce)) != 0)
                goto Exit;
            buf->off += sched->hashes[0].algo->digest_size;
        });
        /* key-exchange */
        ptls_buffer_push16(buf, key_exchange_id);
        /* cipher-suite */
        ptls_buffer_push16(buf, csid);
        /* ticket_age_add */
        ptls_buffer_push32(buf, ticket_age_add);
        /* session ID context */
        ptls_buffer_push_block(buf, 2, {
            if (ctx->ticket_context.is_set) {
                ptls_buffer_pushv(buf, ctx->ticket_context.bytes, sizeof(ctx->ticket_context.bytes));
            } else if (server_name != NULL) {
                ptls_buffer_pushv(buf, server_name, strlen(server_name));
            }
        });
        /* alpn */
        ptls_buffer_push_block(buf, 1, {
            if (negotiated_protocol != NULL)
                ptls_buffer_pushv(buf, negotiated_protocol, strlen(negotiated_protocol));
        });
    });

Exit:
    return ret;
}